

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

bool __thiscall bench::push_back_solver(bench *this,string_view name)

{
  bool bVar1;
  solver *__args;
  char *in_RCX;
  string_view name_00;
  undefined1 local_50 [8];
  optional<bench::solver> slv;
  bench *this_local;
  string_view name_local;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  slv.super__Optional_base<bench::solver,_false,_false>._M_payload.
  super__Optional_payload<bench::solver,_true,_false,_false>.
  super__Optional_payload_base<bench::solver>._32_8_ = this;
  solver::make_solver((optional<bench::solver> *)local_50,(solver *)name._M_len,name_00);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_50);
  if (bVar1) {
    __args = std::optional<bench::solver>::operator*((optional<bench::solver> *)local_50);
    std::vector<bench::solver,std::allocator<bench::solver>>::emplace_back<bench::solver&>
              ((vector<bench::solver,std::allocator<bench::solver>> *)&this->solvers,__args);
  }
  std::optional<bench::solver>::~optional((optional<bench::solver> *)local_50);
  return bVar1;
}

Assistant:

bool push_back_solver(std::string_view name)
    {
        auto slv = solver::make_solver(name);
        if (!slv)
            return false;

        solvers.emplace_back(*slv);

        return true;
    }